

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_detour_impl.c
# Opt level: O1

int funchook_detour_impl_install(detour_impl_handle handle,_func_void **target,_func_void *hook)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (hook != (_func_void *)0x0 &&
      (target != (_func_void **)0x0 && handle != (detour_impl_handle)0x0)) {
    iVar1 = funchook_prepare();
    if (iVar1 == 0) {
      iVar1 = funchook_install(handle,0);
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  return uVar2;
}

Assistant:

int funchook_detour_impl_install(detour_impl_handle handle, void (**target)(void), void (*hook)(void))
{
	funchook_t *handle_impl = handle;

	if (handle_impl != NULL && target != NULL && hook != NULL)
	{
		union funchook_detour_impl_cast hook_cast = { hook };

		if (funchook_prepare(handle_impl, (void **)target, hook_cast.ptr) != FUNCHOOK_ERROR_SUCCESS)
		{
			return 1;
		}

		if (funchook_install(handle_impl, 0) != FUNCHOOK_ERROR_SUCCESS)
		{
			return 1;
		}

		return 0;
	}

	return 1;
}